

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::addTargetToInterface(CommonCore *this,ActionMessage *command)

{
  bool bVar1;
  FederateStates FVar2;
  action_t aVar3;
  action_t aVar4;
  GlobalFederateId *this_00;
  TimeRepresentation<count_time<9,_long>_> this_01;
  GlobalHandle hand;
  ActionMessage *in_RSI;
  SmallBuffer *in_RDI;
  ActionMessage pub;
  CommonCore *in_stack_00000120;
  pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_> lastData;
  BasicHandleInfo *handle;
  FederateState *fed_1;
  FederateState *fed;
  ActionMessage *in_stack_000002b8;
  TranslatorFederate *in_stack_000002c0;
  ActionMessage *in_stack_000003c8;
  FilterFederate *in_stack_000003d0;
  ActionMessage *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int32_t in_stack_fffffffffffffe34;
  HandleManager *in_stack_fffffffffffffe38;
  TimeRepresentation<count_time<9,_long>_> *this_02;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  byte bVar5;
  ActionMessage *this_03;
  CommonCore *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  GlobalFederateId federateID;
  Time local_168;
  FederateState *in_stack_fffffffffffffec0;
  InterfaceHandle in_stack_fffffffffffffecc;
  ActionMessage *in_stack_ffffffffffffff38;
  SmallBuffer local_b0;
  TimeRepresentation<count_time<9,_long>_> local_50;
  BasicHandleInfo *local_48;
  BaseType local_3c;
  FederateState *local_38;
  BaseType local_2c;
  BaseType local_28;
  BaseType local_24;
  FederateState *local_20;
  BaseType local_14;
  ActionMessage *local_10;
  
  federateID.gid = (BaseType)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  local_10 = in_RSI;
  aVar3 = ActionMessage::action(in_RSI);
  if (aVar3 == cmd_add_filter) {
    if (*(long *)(in_RDI[0x1d].buffer._M_elems + 8) == 0) {
      generateFilterFederate(in_stack_00000120);
    }
    FilterFederate::processFilterInfo
              ((FilterFederate *)lastData.first.buffer._M_elems._56_8_,
               (ActionMessage *)lastData.first.buffer._M_elems._48_8_);
    local_14 = *(BaseType *)((in_RDI->buffer)._M_elems + 0x14);
    bVar1 = GlobalFederateId::operator!=(&local_10->source_id,(GlobalBrokerId)local_14);
    if (((bVar1) && ((in_RDI[2].buffer._M_elems[0x1d] & 1) == 0)) &&
       (bVar1 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(local_10,error_flag),
       !bVar1)) {
      local_24 = (local_10->dest_id).gid;
      local_20 = getFederateCore(in_stack_fffffffffffffe68,federateID);
      if (local_20 != (FederateState *)0x0) {
        ActionMessage::setAction(local_10,cmd_add_dependent);
        FederateState::addAction
                  ((FederateState *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   in_stack_fffffffffffffe28);
      }
    }
  }
  else {
    this_00 = &local_10->dest_id;
    local_28 = (BaseType)
               std::atomic::operator_cast_to_GlobalFederateId
                         ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffe28);
    bVar1 = GlobalFederateId::operator==(this_00,(GlobalFederateId)local_28);
    if (bVar1) {
      FilterFederate::handleMessage(in_stack_000003d0,in_stack_000003c8);
    }
    else {
      this_03 = (ActionMessage *)&local_10->dest_id;
      local_2c = (BaseType)
                 std::atomic::operator_cast_to_GlobalFederateId
                           ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffe28);
      bVar1 = GlobalFederateId::operator==((GlobalFederateId *)this_03,(GlobalFederateId)local_2c);
      if (bVar1) {
        TranslatorFederate::handleMessage(in_stack_000002c0,in_stack_000002b8);
      }
      else {
        local_3c = (local_10->dest_id).gid;
        local_38 = getFederateCore(in_stack_fffffffffffffe68,federateID);
        if (local_38 != (FederateState *)0x0) {
          bVar1 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(local_10,error_flag);
          if (!bVar1) {
            FederateState::addAction
                      ((FederateState *)
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       in_stack_fffffffffffffe28);
          }
          aVar3 = (action_t)((ulong)(in_RDI[0x13].buffer._M_elems + 0x38) >> 0x20);
          InterfaceHandle::baseValue(&local_10->dest_handle);
          local_48 = HandleManager::getHandleInfo
                               (in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
          if (local_48 != (BasicHandleInfo *)0x0) {
            setAsUsed((CommonCore *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                      (BasicHandleInfo *)in_stack_fffffffffffffe38);
            aVar4 = ActionMessage::action(local_10);
            if ((aVar4 == cmd_add_subscriber) &&
               (FVar2 = FederateState::getState((FederateState *)0x553fd2), FVar2 != CREATED)) {
              FederateState::getPublishedValue(in_stack_fffffffffffffec0,in_stack_fffffffffffffecc);
              this_02 = &local_50;
              this_01 = TimeRepresentation<count_time<9,_long>_>::minVal();
              bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                                (this_02,(TimeRepresentation<count_time<9,_long>_> *)
                                         &stack0xffffffffffffff40);
              bVar5 = 0;
              if (bVar1) {
                bVar1 = SmallBuffer::empty(&local_b0);
                in_stack_fffffffffffffe34 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe34);
                bVar5 = bVar1 ^ 0xff;
              }
              if ((bVar5 & 1) != 0) {
                ActionMessage::ActionMessage(this_03,aVar3);
                ActionMessage::setSource((ActionMessage *)&stack0xfffffffffffffe78,local_48->handle)
                ;
                hand = ActionMessage::getSource(in_stack_fffffffffffffe28);
                ActionMessage::setDestination((ActionMessage *)&stack0xfffffffffffffe78,hand);
                SmallBuffer::operator=((SmallBuffer *)hand,in_RDI);
                local_168.internalTimeCode = local_50.internalTimeCode;
                routeMessage((CommonCore *)this_01.internalTimeCode,in_stack_ffffffffffffff38);
                ActionMessage::~ActionMessage
                          ((ActionMessage *)
                           CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
              }
              std::pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_>::~pair
                        ((pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_> *)
                         0x554152);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CommonCore::addTargetToInterface(ActionMessage& command)
{
    if (command.action() == CMD_ADD_FILTER) {
        if (filterFed == nullptr) {
            generateFilterFederate();
        }
        filterFed->processFilterInfo(command);
        if (command.source_id != global_broker_id_local) {
            if (!globalTime) {
                if (!checkActionFlag(command, error_flag)) {
                    auto* fed = getFederateCore(command.dest_id);
                    if (fed != nullptr) {
                        command.setAction(CMD_ADD_DEPENDENT);
                        fed->addAction(command);
                    }
                }
            }
        }
    } else if (command.dest_id == filterFedID) {
        // just forward these to the appropriate federate
        filterFed->handleMessage(command);
    } else if (command.dest_id == translatorFedID) {
        // just forward these to the appropriate federate
        translatorFed->handleMessage(command);
    } else {
        auto* fed = getFederateCore(command.dest_id);
        if (fed != nullptr) {
            if (!checkActionFlag(command, error_flag)) {
                fed->addAction(command);
            }
            auto* handle = loopHandles.getHandleInfo(command.dest_handle.baseValue());
            if (handle != nullptr) {
                setAsUsed(handle);
                if (command.action() == CMD_ADD_SUBSCRIBER &&
                    fed->getState() > FederateStates::CREATED) {
                    auto lastData = fed->getPublishedValue(command.dest_handle);
                    if (lastData.second > Time::minVal() && !lastData.first.empty()) {
                        ActionMessage pub(CMD_PUB);
                        pub.setSource(handle->handle);
                        pub.setDestination(command.getSource());
                        pub.payload = std::move(lastData.first);
                        pub.actionTime = lastData.second;
                        routeMessage(std::move(pub));
                    }
                }
            }
        }
    }
}